

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O3

void __thiscall
rsg::ProgramExecutor::setTexture
          (ProgramExecutor *this,int samplerNdx,TextureCube *texture,Sampler *sampler)

{
  bool bVar1;
  undefined3 uVar2;
  DepthStencilMode DVar3;
  mapped_type *pmVar4;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_38 = sampler->compareChannel;
  local_58._0_4_ = sampler->wrapS;
  local_58._4_4_ = sampler->wrapT;
  uStack_50._0_4_ = sampler->wrapR;
  uStack_50._4_4_ = sampler->minFilter;
  local_48._0_4_ = sampler->magFilter;
  local_48._4_4_ = sampler->lodThreshold;
  uStack_40._0_1_ = sampler->normalizedCoords;
  uStack_40._1_3_ = *(undefined3 *)&sampler->field_0x19;
  uStack_40._4_4_ = sampler->compare;
  bVar1 = sampler->seamlessCubeMap;
  uVar2 = *(undefined3 *)&sampler->field_0x35;
  DVar3 = sampler->depthStencilMode;
  local_28 = *(undefined8 *)&(sampler->borderColor).v;
  uStack_20 = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
  local_5c = samplerNdx;
  pmVar4 = std::
           map<int,_rsg::SamplerCube,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::SamplerCube>_>_>
           ::operator[](&this->m_samplersCube,&local_5c);
  pmVar4->m_texture = texture;
  (pmVar4->m_sampler).wrapS = (undefined4)local_58;
  (pmVar4->m_sampler).wrapT = local_58._4_4_;
  (pmVar4->m_sampler).wrapR = (undefined4)uStack_50;
  (pmVar4->m_sampler).minFilter = uStack_50._4_4_;
  (pmVar4->m_sampler).magFilter = (undefined4)local_48;
  (pmVar4->m_sampler).lodThreshold = (float)local_48._4_4_;
  (pmVar4->m_sampler).normalizedCoords = (bool)(undefined1)uStack_40;
  *(undefined3 *)&(pmVar4->m_sampler).field_0x19 = uStack_40._1_3_;
  (pmVar4->m_sampler).compare = uStack_40._4_4_;
  (pmVar4->m_sampler).compareChannel = local_38;
  *(undefined8 *)&(pmVar4->m_sampler).borderColor.v = local_28;
  *(undefined8 *)((long)&(pmVar4->m_sampler).borderColor.v + 8) = uStack_20;
  (pmVar4->m_sampler).seamlessCubeMap = bVar1;
  *(undefined3 *)&(pmVar4->m_sampler).field_0x35 = uVar2;
  (pmVar4->m_sampler).depthStencilMode = DVar3;
  return;
}

Assistant:

void ProgramExecutor::setTexture (int samplerNdx, const tcu::TextureCube* texture, const tcu::Sampler& sampler)
{
	m_samplersCube[samplerNdx] = SamplerCube(texture, sampler);
}